

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

NeuralNetwork * __thiscall
CoreML::Specification::LoopLayerParams::mutable_conditionnetwork(LoopLayerParams *this)

{
  NeuralNetwork *this_00;
  LoopLayerParams *this_local;
  
  if (this->conditionnetwork_ == (NeuralNetwork *)0x0) {
    this_00 = (NeuralNetwork *)operator_new(0x58);
    NeuralNetwork::NeuralNetwork(this_00);
    this->conditionnetwork_ = this_00;
  }
  return this->conditionnetwork_;
}

Assistant:

inline ::CoreML::Specification::NeuralNetwork* LoopLayerParams::mutable_conditionnetwork() {
  
  if (conditionnetwork_ == NULL) {
    conditionnetwork_ = new ::CoreML::Specification::NeuralNetwork;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.LoopLayerParams.conditionNetwork)
  return conditionnetwork_;
}